

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O0

ShmDataBuffer * __thiscall adios2::aggregator::MPIShmChain::LockConsumerBuffer(MPIShmChain *this)

{
  ShmDataBuffer *this_00;
  long in_RDI;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_00000010;
  ShmDataBuffer *sdb;
  double local_20;
  duration<double,std::ratio<1l,1l>> local_18 [8];
  Spinlock *this_01;
  
  this_01 = (Spinlock *)0x0;
  while (*(int *)(*(long *)(in_RDI + 0x88) + 8) == 0) {
    local_20 = 1e-05;
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>(local_18,&local_20);
    std::this_thread::sleep_for<double,std::ratio<1l,1l>>(in_stack_00000010);
  }
  shm::Spinlock::lock(this_01);
  if (*(int *)(*(long *)(in_RDI + 0x88) + 4) == 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 4) = 2;
    this_00 = (ShmDataBuffer *)(*(long *)(in_RDI + 0x88) + 0x28);
    *(undefined8 *)(*(long *)(in_RDI + 0x88) + 0x38) = *(undefined8 *)(in_RDI + 0x98);
  }
  else {
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 4) = 1;
    this_00 = (ShmDataBuffer *)(*(long *)(in_RDI + 0x88) + 0x10);
    *(undefined8 *)(*(long *)(in_RDI + 0x88) + 0x20) = *(undefined8 *)(in_RDI + 0x90);
  }
  shm::Spinlock::unlock((Spinlock *)this_00);
  if (*(int *)(*(long *)(in_RDI + 0x88) + 4) == 1) {
    shm::Spinlock::lock((Spinlock *)this_00);
  }
  else {
    shm::Spinlock::lock((Spinlock *)this_00);
  }
  return this_00;
}

Assistant:

MPIShmChain::ShmDataBuffer *MPIShmChain::LockConsumerBuffer()
{
    MPIShmChain::ShmDataBuffer *sdb = nullptr;

    // Sleep until there is at least one buffer filled
    while (m_Shm->NumBuffersFull < 1)
    {
        std::this_thread::sleep_for(std::chrono::duration<double>(0.00001));
    }
    // At this point we know buffer A has content or going to have content
    // when we successfully lock it

    m_Shm->lockSegment.lock();
    if (m_Shm->consumerBuffer == LastBufferUsed::A)

    {
        m_Shm->consumerBuffer = LastBufferUsed::B;
        sdb = &m_Shm->sdbB;
        // point to shm data buffer (in local process memory)
        sdb->buf = m_ShmBufB;
    }
    else // None or B
    {
        m_Shm->consumerBuffer = LastBufferUsed::A;
        sdb = &m_Shm->sdbA;
        // point to shm data buffer (in local process memory)
        sdb->buf = m_ShmBufA;
    }
    m_Shm->lockSegment.unlock();

    // We determined we want a specific buffer
    // Now we need to get a lock on it in case producer is using it
    if (m_Shm->consumerBuffer == LastBufferUsed::A)
    {
        m_Shm->lockA.lock();
    }
    else
    {
        m_Shm->lockB.lock();
    }

    return sdb;
}